

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_float32_encode(sysbvm_context_t *context,float value)

{
  uint32_t floatBits;
  float value_local;
  sysbvm_context_t *context_local;
  
  return (ulong)(uint)value << 4 | 0xd;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_float32_encode(sysbvm_context_t *context, float value)
{
    if(sizeof(float) < sizeof(sysbvm_tuple_t))
    {
        uint32_t floatBits = 0;
        memcpy(&floatBits, &value, 4);
        return ((sysbvm_tuple_t)floatBits << SYSBVM_TUPLE_TAG_BIT_COUNT) | SYSBVM_TUPLE_TAG_FLOAT32;
    }
    else
    {
        sysbvm_object_tuple_t *result = sysbvm_context_allocateByteTuple(context, context->roots.float32Type, sizeof(sysbvm_float32_t));
        *((sysbvm_float32_t*)result->bytes) = value;
        return (sysbvm_tuple_t)result;
    }
}